

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldscript.c
# Opt level: O2

LinkedSection * next_secdef(GlobalVars *gv)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  char *name;
  LinkedSection *pLVar4;
  MemoryDescr *md;
  lword s_lma;
  lword s_addr;
  char s_type [256];
  
  current_ls = (LinkedSection *)0x0;
  level = 1;
  do {
    while (name = getword(), name != (char *)0x0) {
      iVar2 = check_command(gv,name,2);
      if (iVar2 == 0) {
        cVar1 = getchr();
        if (cVar1 == '=') {
          symbol_assignment(gv,name,'\0');
        }
        else {
          back(1);
          pLVar4 = find_lnksec(gv,name,'\0','\0','\0','\0');
          if (pLVar4 == (LinkedSection *)0x0) {
            ierror("next_secdef(): No Section for %s defined",name);
          }
          else {
            current_ls = pLVar4;
            uVar3 = startofsecdef(&s_addr,s_type,&s_lma);
            if (uVar3 != 0) {
              if ((uVar3 & 2) != 0) {
                change_address(pLVar4->relocmem,s_addr);
              }
              if (3 < uVar3) {
                md = pLVar4->destmem;
                if (md == pLVar4->relocmem) {
                  md = add_memblock("lma",0,0x7fffffffffffffff);
                  pLVar4->destmem = md;
                }
                change_address(md,s_lma);
              }
              secdefbase = (char *)0x0;
              return pLVar4;
            }
          }
        }
      }
    }
    cVar1 = getchr();
  } while (cVar1 == ';');
  back(1);
  return (LinkedSection *)0x0;
}

Assistant:

struct LinkedSection *next_secdef(struct GlobalVars *gv)
/* Find next section definition in script and return the machting
   structure. */
{
  char *keyword;
  struct Phdr *p;

  level = 1;
  current_ls = NULL;

  do {
    while (keyword = getword()) {
      if (check_command(gv,keyword,SCMDF_GLOBAL)) {
        continue;
      }
      else if (getchr() == '=') {
        symbol_assignment(gv,keyword,0);
      }

      else {
        /* check for section definition */
        char s_type[MAXLEN];
        struct LinkedSection *ls;
        int ret;
        lword s_addr,s_lma;

        back(1);
        if (ls = find_lnksec(gv,keyword,0,0,0,0)) {
          current_ls = ls;
          if (ret = startofsecdef(&s_addr,s_type,&s_lma)) {
            if (ret & 2)
              change_address(ls->relocmem,s_addr);
            if (ret & 4) {
              if (ls->destmem == ls->relocmem)
                ls->destmem = add_memblock("lma",MEM_DEFORG,MEM_DEFLEN);
              change_address(ls->destmem,s_lma);
            }

            secdefbase = NULL;
            return ls;
          }
        }
        else
          ierror("next_secdef(): No Section for %s defined",keyword);
      }
    }
  }
  while (getchr() == ';');
  back(1);

#if 0 /* @@@ don't do it - it modifies header size !!! */
  /* scan for empty segments and declare them as unused */
  for (p=gv->phdrlist; p; p=p->next) {
    if (p->type!=PT_PHDR && (p->start==ADDR_NONE || p->start_vma==ADDR_NONE)) {
      p->start = p->start_vma = p->file_end = p->mem_end = 0;
      p->flags &= ~PHDR_USED;
    }
  }
#endif
  return NULL;
}